

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O3

ListType *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::MILSpec::ListType>
          (Arena *arena)

{
  ListType *this;
  
  if (arena == (Arena *)0x0) {
    this = (ListType *)operator_new(0x28);
    CoreML::Specification::MILSpec::ListType::ListType(this,(Arena *)0x0,false);
  }
  else {
    this = (ListType *)
           AllocateAlignedWithHook
                     (arena,0x28,(type_info *)&CoreML::Specification::MILSpec::ListType::typeinfo);
    CoreML::Specification::MILSpec::ListType::ListType(this,arena,false);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }